

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O3

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  timeval newer;
  char line [257];
  char format [40];
  char local_168 [4];
  undefined1 auStack_164 [268];
  undefined1 local_58 [40];
  
  newer = tvnow();
  lVar11 = dltotal + ultotal;
  lVar6 = *(long *)((long)clientp + 0x30) + lVar11;
  lVar10 = dlnow + ulnow;
  lVar12 = *(long *)((long)clientp + 0x30) + lVar10;
  if (*clientp == 0) {
    iVar2 = 1;
  }
  else {
    if (lVar6 == 0) {
      lVar6 = tvdiff(newer,*(timeval *)((long)clientp + 0x10));
      if (lVar6 < 100) {
        return 0;
      }
      lVar6 = *(long *)((long)clientp + 8);
      iVar2 = *(int *)((long)clientp + 0x20);
      iVar8 = 0;
      curl_msnprintf(local_168,0x100,"%*s\r",iVar2 + -1," ");
      iVar3 = *(int *)((long)clientp + 0x3c);
      auStack_164[iVar3] = 0x2d;
      builtin_strncpy(local_168 + iVar3,"-=O=",4);
      uVar1 = *(uint *)((long)clientp + 0x38);
      uVar9 = 10000 / (long)(iVar2 + -2) & 0xffffffff;
      local_168[(int)(sinus[uVar1 % 200] / uVar9)] = '#';
      local_168[(int)(sinus[uVar1 + ((uVar1 + 5) / 200) * -200 + 5] / uVar9)] = '#';
      local_168[(int)(sinus[uVar1 + ((uVar1 + 10) / 200) * -200 + 10] / uVar9)] = '#';
      local_168[(int)(sinus[uVar1 + ((uVar1 + 0xf) / 200) * -200 + 0xf] / uVar9)] = '#';
      fputs(local_168,*(FILE **)((long)clientp + 0x28));
      uVar1 = *(int *)((long)clientp + 0x38) + 2;
      uVar4 = *(int *)((long)clientp + 0x38) - 0xc6;
      if (uVar1 < 200) {
        uVar4 = uVar1;
      }
      *(uint *)((long)clientp + 0x38) = uVar4;
      if (lVar12 != lVar6) {
        iVar8 = *(int *)((long)clientp + 0x40);
      }
      iVar8 = iVar8 + *(int *)((long)clientp + 0x3c);
      *(int *)((long)clientp + 0x3c) = iVar8;
      iVar2 = *(int *)((long)clientp + 0x20) + -6;
      uVar7 = 0xffffffff;
      if (iVar8 < iVar2) {
        if (iVar8 < 0) {
          iVar2 = 0;
          uVar7 = 1;
          goto LAB_0010c461;
        }
      }
      else {
LAB_0010c461:
        *(undefined4 *)((long)clientp + 0x40) = uVar7;
        *(int *)((long)clientp + 0x3c) = iVar2;
      }
      *(int *)clientp = *clientp + 1;
      goto LAB_0010c469;
    }
    if (*(long *)((long)clientp + 8) == lVar12) {
      return 0;
    }
    lVar5 = tvdiff(newer,*(timeval *)((long)clientp + 0x10));
    if (lVar5 < 100 && lVar10 < lVar11) {
      return 0;
    }
    iVar2 = *clientp + 1;
  }
  *(int *)clientp = iVar2;
  if ((0 < lVar6) && (lVar12 != *(long *)((long)clientp + 8))) {
    if (lVar11 < lVar10) {
      lVar6 = lVar12;
    }
    iVar8 = *(int *)((long)clientp + 0x20) + -7;
    iVar3 = (int)((double)iVar8 * ((double)lVar12 / (double)lVar6));
    iVar2 = 0x100;
    if (iVar3 < 0x100) {
      iVar2 = iVar3;
    }
    memset(local_168,0x23,(long)iVar2);
    local_168[iVar2] = '\0';
    curl_msnprintf(local_58,0x28,"\r%%-%ds %%5.1f%%%%",iVar8);
    curl_mfprintf(((double)lVar12 / (double)lVar6) * 100.0,*(undefined8 *)((long)clientp + 0x28),
                  local_58,local_168);
  }
LAB_0010c469:
  fflush(*(FILE **)((long)clientp + 0x28));
  *(long *)((long)clientp + 8) = lVar12;
  *(timeval *)((long)clientp + 0x10) = newer;
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  char line[MAX_BARLENGTH + 1];
  char format[40];
  double frac;
  double percent;
  int barwidth;
  int num;
  struct timeval now = tvnow();
  struct ProgressData *bar = (struct ProgressData *)clientp;
  curl_off_t total;
  curl_off_t point;

  /* expected transfer size */
  total = dltotal + ultotal + bar->initial_size;

  /* we've come this far */
  point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress didn't change since last invoke */
        return 0;
      else if((tvdiff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we're at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(tvdiff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  if((total > 0) && (point != bar->prev)) {
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    snprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  return 0;
}